

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O2

void __thiscall powerpc_test_cpu::test_rotate(powerpc_test_cpu *this)

{
  gen_xer_values(this,0,0x80000000);
  puts("Testing rlwimi");
  test_instruction_RRIII(this,"rlwimi",0x50830000);
  puts("Testing rlwimi.");
  test_instruction_RRIII(this,"rlwimi.",0x50830001);
  puts("Testing rlwinm");
  test_instruction_RRIII(this,"rlwinm",0x54830000);
  puts("Testing rlwinm.");
  test_instruction_RRIII(this,"rlwinm.",0x54830001);
  puts("Testing rlwnm");
  test_instruction_RRRII(this,"rlwnm",0x5c832800);
  puts("Testing rlwnm.");
  test_instruction_RRRII(this,"rlwnm.",0x5c832801);
  return;
}

Assistant:

void powerpc_test_cpu::test_rotate(void)
{
#if TEST_ROTATE
	gen_xer_values(0, SO);
	TEST_INSTRUCTION(RRIII,"rlwimi",	_M (20,RA,RD,00,00,00,0));
	TEST_INSTRUCTION(RRIII,"rlwimi.",	_M (20,RA,RD,00,00,00,1));
	TEST_INSTRUCTION(RRIII,"rlwinm",	_M (21,RA,RD,00,00,00,0));
	TEST_INSTRUCTION(RRIII,"rlwinm.",	_M (21,RA,RD,00,00,00,1));
	TEST_INSTRUCTION(RRRII,"rlwnm",		_M (23,RA,RD,RB,00,00,0));
	TEST_INSTRUCTION(RRRII,"rlwnm.",	_M (23,RA,RD,RB,00,00,1));
#endif
}